

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O3

int ssl_parse_signature_algorithms_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  mbedtls_md_type_t *pmVar1;
  mbedtls_md_type_t mVar2;
  byte *pbVar3;
  mbedtls_md_type_t mVar4;
  int iVar5;
  mbedtls_md_type_t *pmVar6;
  byte *pbVar7;
  
  if (((buf[1] & 1) == 0) && ((ulong)buf[1] + (ulong)*buf * 0x100 + 2 == len)) {
    pmVar6 = (mbedtls_md_type_t *)ssl->conf->sig_hashes;
    if (*pmVar6 == MBEDTLS_MD_NONE) {
LAB_00121785:
      iVar5 = 0;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xdf,"no signature_algorithm in common");
    }
    else {
      pbVar3 = buf + 2;
      do {
        while (pbVar7 = pbVar3, buf + len <= pbVar7) {
          pmVar1 = pmVar6 + 1;
          pmVar6 = pmVar6 + 1;
          pbVar3 = buf + 2;
          if (*pmVar1 == MBEDTLS_MD_NONE) goto LAB_00121785;
        }
        mVar2 = *pmVar6;
        mVar4 = mbedtls_ssl_md_alg_from_hash(*pbVar7);
        pbVar3 = pbVar7 + 2;
      } while (mVar2 != mVar4);
      ssl->handshake->sig_alg = (uint)*pbVar7;
      iVar5 = 0;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xe4,"client hello v3, signature_algorithm ext: %d");
    }
  }
  else {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xcb,"bad client hello message");
    iVar5 = -0x7900;
  }
  return iVar5;
}

Assistant:

static int ssl_parse_signature_algorithms_ext( mbedtls_ssl_context *ssl,
                                               const unsigned char *buf,
                                               size_t len )
{
    size_t sig_alg_list_size;
    const unsigned char *p;
    const unsigned char *end = buf + len;
    const int *md_cur;


    sig_alg_list_size = ( ( buf[0] << 8 ) | ( buf[1] ) );
    if( sig_alg_list_size + 2 != len ||
        sig_alg_list_size % 2 != 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client hello message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );
    }

    /*
     * For now, ignore the SignatureAlgorithm part and rely on offered
     * ciphersuites only for that part. To be fixed later.
     *
     * So, just look at the HashAlgorithm part.
     */
    for( md_cur = ssl->conf->sig_hashes; *md_cur != MBEDTLS_MD_NONE; md_cur++ ) {
        for( p = buf + 2; p < end; p += 2 ) {
            if( *md_cur == (int) mbedtls_ssl_md_alg_from_hash( p[0] ) ) {
                ssl->handshake->sig_alg = p[0];
                goto have_sig_alg;
            }
        }
    }

    /* Some key echanges do not need signatures at all */
    MBEDTLS_SSL_DEBUG_MSG( 3, ( "no signature_algorithm in common" ) );
    return( 0 );

have_sig_alg:
    MBEDTLS_SSL_DEBUG_MSG( 3, ( "client hello v3, signature_algorithm ext: %d",
                   ssl->handshake->sig_alg ) );

    return( 0 );
}